

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlSkipBlankCharsPE(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlEntityPtr pxVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  pxVar2 = ctxt->input->entity;
  if (pxVar2 == (xmlEntityPtr)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = (pxVar2->etype & ~XML_INTERNAL_GENERAL_ENTITY) == XML_INTERNAL_PARAMETER_ENTITY;
  }
  bVar8 = ctxt->inSubset == 2;
  if (pxVar2 != (xmlEntityPtr)0x0 && !bVar8) {
    bVar8 = pxVar2->etype == XML_EXTERNAL_PARAMETER_ENTITY;
  }
  if ((!bVar7) && (!bVar8)) {
    iVar5 = xmlSkipBlankChars(ctxt);
    return iVar5;
  }
  iVar5 = 0;
  if (ctxt->disableSAX < 2) {
    iVar5 = 0;
    do {
      pbVar3 = ctxt->input->cur;
      bVar1 = *pbVar3;
      uVar6 = (ulong)bVar1;
      if (uVar6 < 0x26) {
        if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
          if (uVar6 != 0x25) goto LAB_0013706b;
          if (!bVar8) {
            return iVar5;
          }
          uVar6 = (ulong)pbVar3[1];
          if ((uVar6 < 0x21) && ((0x100002601U >> (uVar6 & 0x3f) & 1) != 0)) {
            return iVar5;
          }
          xmlParsePEReference(ctxt);
          goto LAB_0013707b;
        }
        xmlNextChar(ctxt);
      }
      else {
LAB_0013706b:
        if (bVar1 != 0) {
          return iVar5;
        }
        if (!bVar7) {
          return iVar5;
        }
        xmlPopPE(ctxt);
LAB_0013707b:
        pxVar2 = ctxt->input->entity;
        if (pxVar2 == (xmlEntityPtr)0x0) {
          bVar7 = false;
        }
        else {
          bVar7 = true;
          if (pxVar2->etype != XML_INTERNAL_PARAMETER_ENTITY) {
            bVar7 = pxVar2->etype == XML_EXTERNAL_PARAMETER_ENTITY;
          }
        }
        bVar8 = ctxt->inSubset == 2;
        if (pxVar2 != (xmlEntityPtr)0x0 && !bVar8) {
          bVar8 = pxVar2->etype == XML_EXTERNAL_PARAMETER_ENTITY;
        }
      }
      iVar4 = iVar5 + 1;
      if (iVar5 == 0x7fffffff) {
        iVar4 = iVar5;
      }
      iVar5 = iVar4;
    } while (ctxt->disableSAX < 2);
  }
  return iVar5;
}

Assistant:

static int
xmlSkipBlankCharsPE(xmlParserCtxtPtr ctxt) {
    int res = 0;
    int inParam;
    int expandParam;

    inParam = PARSER_IN_PE(ctxt);
    expandParam = PARSER_EXTERNAL(ctxt);

    if (!inParam && !expandParam)
        return(xmlSkipBlankChars(ctxt));

    /*
     * It's Okay to use CUR/NEXT here since all the blanks are on
     * the ASCII range.
     */
    while (PARSER_STOPPED(ctxt) == 0) {
        if (IS_BLANK_CH(CUR)) { /* CHECKED tstblanks.xml */
            NEXT;
        } else if (CUR == '%') {
            if ((expandParam == 0) ||
                (IS_BLANK_CH(NXT(1))) || (NXT(1) == 0))
                break;

            /*
             * Expand parameter entity. We continue to consume
             * whitespace at the start of the entity and possible
             * even consume the whole entity and pop it. We might
             * even pop multiple PEs in this loop.
             */
            xmlParsePEReference(ctxt);

            inParam = PARSER_IN_PE(ctxt);
            expandParam = PARSER_EXTERNAL(ctxt);
        } else if (CUR == 0) {
            if (inParam == 0)
                break;

            xmlPopPE(ctxt);

            inParam = PARSER_IN_PE(ctxt);
            expandParam = PARSER_EXTERNAL(ctxt);
        } else {
            break;
        }

        /*
         * Also increase the counter when entering or exiting a PERef.
         * The spec says: "When a parameter-entity reference is recognized
         * in the DTD and included, its replacement text MUST be enlarged
         * by the attachment of one leading and one following space (#x20)
         * character."
         */
        if (res < INT_MAX)
            res++;
    }

    return(res);
}